

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cc
# Opt level: O0

int __thiscall
RpcClient::IssueRequest
          (RpcClient *this,shared_ptr<RpcMessage> *request,shared_ptr<RpcMessage> *response)

{
  int iVar1;
  __int_type _Var2;
  ostream *poVar3;
  element_type *peVar4;
  ostream *poVar5;
  shared_ptr<RpcMessage> *this_00;
  long in_RDI;
  unsigned_long_long ticket;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffff48;
  NarpcStaging *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  NarpcStaging *in_stack_ffffffffffffff60;
  int socket;
  NarpcStaging *this_01;
  _func_int **local_20;
  
  _Var2 = std::__atomic_base<unsigned_long_long>::operator++
                    ((__atomic_base<unsigned_long_long> *)(in_RDI + 0x70),0);
  local_20 = (_func_int **)(_Var2 & 7);
  if (local_20 == (_func_int **)0x0) {
    local_20 = (_func_int **)0x1;
  }
  std::shared_ptr<RpcMessage>::operator=
            ((shared_ptr<RpcMessage> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  NarpcStaging::Clear(in_stack_ffffffffffffff50);
  poVar3 = std::operator<<((ostream *)&std::cout,"RpcClient::IssueRequest ");
  peVar4 = std::__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x17809c);
  this_01 = (NarpcStaging *)&stack0xffffffffffffffd8;
  (*peVar4->_vptr_RpcMessage[4])();
  poVar5 = std::operator<<(poVar3,(string *)this_01);
  socket = (int)((ulong)poVar3 >> 0x20);
  poVar3 = std::operator<<(poVar5," (size ");
  peVar4 = std::__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1780ed);
  iVar1 = (*peVar4->_vptr_RpcMessage[3])();
  poVar5 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar5 = std::operator<<(poVar5,")");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::string::~string(&stack0xffffffffffffffd8);
  this_00 = (shared_ptr<RpcMessage> *)(in_RDI + 0x20);
  peVar4 = std::__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x178164);
  (*peVar4->_vptr_RpcMessage[3])();
  NarpcStaging::AddHeader
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(unsigned_long_long)this_00);
  std::shared_ptr<RpcMessage>::shared_ptr(this_00,in_stack_ffffffffffffff48);
  NarpcStaging::SendMessage(this_01,socket,(shared_ptr<RpcMessage> *)poVar3);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x1781c3);
  return 0;
}

Assistant:

int RpcClient::IssueRequest(shared_ptr<RpcMessage> request,
                            shared_ptr<RpcMessage> response) {
  unsigned long long ticket = counter_++ % RpcClient::kMaxTicket;
  if (ticket == 0) {
    ticket++;
  }
  responseMap_[ticket] = response;
  // stream_.Clear();
  staging_.Clear();

  cout << "RpcClient::IssueRequest " << request->ToString() << " (size "
       << request->Size() << ")" << endl;

  // serialize header
  // stream_.PutInt(request->Size());
  // stream_.PutLong(ticket);
  staging_.AddHeader(request->Size(), ticket);

  // serialize rpc message
  // request->Write(stream_);

  // write message to network
  // stream_.Write(socket_);
  //
  staging_.SendMessage(socket_, request);

  return 0;
}